

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

bool Js::JavascriptArray::IsDirectAccessArray(Var aValue)

{
  bool bVar1;
  undefined1 local_12;
  undefined1 local_11;
  Var aValue_local;
  
  bVar1 = VarIs<Js::RecyclableObject>(aValue);
  local_11 = false;
  if (bVar1) {
    bVar1 = VirtualTableInfo<Js::JavascriptArray>::HasVirtualTable(aValue);
    local_12 = true;
    if (!bVar1) {
      bVar1 = VirtualTableInfo<Js::JavascriptNativeIntArray>::HasVirtualTable(aValue);
      local_12 = true;
      if (!bVar1) {
        local_12 = VirtualTableInfo<Js::JavascriptNativeFloatArray>::HasVirtualTable(aValue);
      }
    }
    local_11 = local_12;
  }
  return local_11;
}

Assistant:

bool JavascriptArray::IsDirectAccessArray(Var aValue)
    {
        return VarIs<RecyclableObject>(aValue) &&
            (VirtualTableInfo<JavascriptArray>::HasVirtualTable(aValue) ||
                VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(aValue) ||
                VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(aValue));
    }